

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UBool ucstrTextAccess(UText *ut,int64_t index,UBool forward)

{
  void *pvVar1;
  bool local_33;
  bool local_32;
  int local_30;
  int iStack_2c;
  UBool retVal;
  int32_t chunkLimit;
  int32_t scanLimit;
  UChar *str;
  int64_t iStack_18;
  UBool forward_local;
  int64_t index_local;
  UText *ut_local;
  
  pvVar1 = ut->context;
  if (index < 0) {
    iStack_18 = 0;
  }
  else {
    iStack_18 = index;
    if (index < ut->chunkNativeLimit) {
      if ((((*(ushort *)((long)pvVar1 + index * 2) & 0xfc00) == 0xdc00) && (0 < index)) &&
         ((*(ushort *)((long)pvVar1 + (index + -1) * 2) & 0xfc00) == 0xd800)) {
        iStack_18 = index + -1;
      }
    }
    else if (ut->a < 0) {
      iStack_2c = (int)index + 0x20;
      if ((0x7fffffff < index + 0x20) || (index + 0x20 < 0)) {
        iStack_2c = 0x7fffffff;
      }
      for (local_30 = (int)ut->chunkNativeLimit; local_30 < iStack_2c; local_30 = local_30 + 1) {
        if (*(short *)((long)pvVar1 + (long)local_30 * 2) == 0) {
          ut->a = (long)local_30;
          ut->chunkLength = local_30;
          ut->nativeIndexingLimit = local_30;
          if (index < local_30) {
            if ((((*(ushort *)((long)pvVar1 + index * 2) & 0xfc00) == 0xdc00) && (0 < index)) &&
               ((*(ushort *)((long)pvVar1 + (index + -1) * 2) & 0xfc00) == 0xd800)) {
              iStack_18 = index + -1;
            }
          }
          else {
            iStack_18 = (int64_t)local_30;
          }
          ut->chunkNativeLimit = (long)local_30;
          ut->providerProperties = ut->providerProperties & 0xfffffffd;
          goto LAB_001c2e0e;
        }
      }
      if ((((*(ushort *)((long)pvVar1 + index * 2) & 0xfc00) == 0xdc00) && (0 < index)) &&
         ((*(ushort *)((long)pvVar1 + (index + -1) * 2) & 0xfc00) == 0xd800)) {
        iStack_18 = index + -1;
      }
      if (local_30 == 0x7fffffff) {
        ut->a = 0x7fffffff;
        ut->chunkLength = 0x7fffffff;
        ut->nativeIndexingLimit = 0x7fffffff;
        if (0x7fffffff < iStack_18) {
          iStack_18 = 0x7fffffff;
        }
        ut->chunkNativeLimit = 0x7fffffff;
        ut->providerProperties = ut->providerProperties & 0xfffffffd;
      }
      else {
        if ((*(ushort *)((long)pvVar1 + (long)(local_30 + -1) * 2) & 0xfc00) == 0xd800) {
          local_30 = local_30 + -1;
        }
        ut->chunkNativeLimit = (long)local_30;
        ut->nativeIndexingLimit = local_30;
        ut->chunkLength = local_30;
      }
    }
    else {
      iStack_18 = ut->a;
    }
  }
LAB_001c2e0e:
  ut->chunkOffset = (int32_t)iStack_18;
  if ((forward == '\0') || (local_32 = true, ut->chunkNativeLimit <= iStack_18)) {
    local_33 = forward == '\0' && 0 < iStack_18;
    local_32 = local_33;
  }
  return local_32;
}

Assistant:

static UBool U_CALLCONV
ucstrTextAccess(UText *ut, int64_t index, UBool  forward) {
    const UChar *str   = (const UChar *)ut->context;

    // pin the requested index to the bounds of the string,
    //  and set current iteration position.
    if (index<0) {
        index = 0;
    } else if (index < ut->chunkNativeLimit) {
        // The request data is within the chunk as it is known so far.
        // Put index on a code point boundary.
        U16_SET_CP_START(str, 0, index);
    } else if (ut->a >= 0) {
        // We know the length of this string, and the user is requesting something
        // at or beyond the length.  Pin the requested index to the length.
        index = ut->a;
    } else {
        // Null terminated string, length not yet known, and the requested index
        //  is beyond where we have scanned so far.
        //  Scan to 32 UChars beyond the requested index.  The strategy here is
        //  to avoid fully scanning a long string when the caller only wants to
        //  see a few characters at its beginning.
        int32_t scanLimit = (int32_t)index + 32;
        if ((index + 32)>INT32_MAX || (index + 32)<0 ) {   // note: int64 expression
            scanLimit = INT32_MAX;
        }

        int32_t chunkLimit = (int32_t)ut->chunkNativeLimit;
        for (; chunkLimit<scanLimit; chunkLimit++) {
            if (str[chunkLimit] == 0) {
                // We found the end of the string.  Remember it, pin the requested index to it,
                //  and bail out of here.
                ut->a = chunkLimit;
                ut->chunkLength = chunkLimit;
                ut->nativeIndexingLimit = chunkLimit;
                if (index >= chunkLimit) {
                    index = chunkLimit;
                } else {
                    U16_SET_CP_START(str, 0, index);
                }

                ut->chunkNativeLimit = chunkLimit;
                ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
                goto breakout;
            }
        }
        // We scanned through the next batch of UChars without finding the end.
        U16_SET_CP_START(str, 0, index);
        if (chunkLimit == INT32_MAX) {
            // Scanned to the limit of a 32 bit length.
            // Forceably trim the overlength string back so length fits in int32
            //  TODO:  add support for 64 bit strings.
            ut->a = chunkLimit;
            ut->chunkLength = chunkLimit;
            ut->nativeIndexingLimit = chunkLimit;
            if (index > chunkLimit) {
                index = chunkLimit;
            }
            ut->chunkNativeLimit = chunkLimit;
            ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
        } else {
            // The endpoint of a chunk must not be left in the middle of a surrogate pair.
            // If the current end is on a lead surrogate, back the end up by one.
            // It doesn't matter if the end char happens to be an unpaired surrogate,
            //    and it's simpler not to worry about it.
            if (U16_IS_LEAD(str[chunkLimit-1])) {
                --chunkLimit;
            }
            // Null-terminated chunk with end still unknown.
            // Update the chunk length to reflect what has been scanned thus far.
            // That the full length is still unknown is (still) flagged by
            //    ut->a being < 0.
            ut->chunkNativeLimit = chunkLimit;
            ut->nativeIndexingLimit = chunkLimit;
            ut->chunkLength = chunkLimit;
        }

    }
breakout:
    U_ASSERT(index<=INT32_MAX);
    ut->chunkOffset = (int32_t)index;

    // Check whether request is at the start or end
    UBool retVal = (forward && index<ut->chunkNativeLimit) || (!forward && index>0);
    return retVal;
}